

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O0

int __thiscall ServerSocketUDP::socketServer(ServerSocketUDP *this,int domain,int type,int protocol)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  int protocol_local;
  int type_local;
  int domain_local;
  ServerSocketUDP *this_local;
  
  iVar1 = socket(domain,type,protocol);
  this->serverSocketFD = iVar1;
  if (this->serverSocketFD < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error in opening socket: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  return 1;
}

Assistant:

int ServerSocketUDP::socketServer(int domain, int type, int protocol) {

    this->serverSocketFD = socket(domain, type, protocol);

    if (this->serverSocketFD < 0) {
        cerr << "Error in opening socket: " << strerror(errno) << endl;
        exit(0);
    }

    return 1;
}